

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp_session.cpp
# Opt level: O2

void __thiscall fineftp::FtpSession::handleFtpCommandACCT(FtpSession *this,string *param_1)

{
  allocator local_31;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,"Unsupported command",&local_31);
  sendFtpMessage(this,SYNTAX_ERROR_UNRECOGNIZED_COMMAND,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void FtpSession::handleFtpCommandACCT(const std::string& /*param*/)
  {
    sendFtpMessage(FtpReplyCode::SYNTAX_ERROR_UNRECOGNIZED_COMMAND, "Unsupported command");
    return;
  }